

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeSIMDExtract<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          SIMDExtractOp op,size_t param_4)

{
  bool bVar1;
  uchar *puVar2;
  Ok local_85 [20];
  allocator<char> local_71;
  string local_70;
  Err local_50;
  _Optional_payload_base<unsigned_char> local_2a;
  size_t sStack_28;
  optional<unsigned_char> lane;
  size_t param_3_local;
  SIMDExtractOp op_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  sStack_28 = param_4;
  local_2a = (_Optional_payload_base<unsigned_char>)ParseInput::takeU8(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2a);
  if (bVar1) {
    puVar2 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_2a);
    NullInstrParserCtx::makeSIMDExtract((NullInstrParserCtx *)ctx,pos,op,*puVar2);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,local_85);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"expected lane index",&local_71);
    ParseInput::err(&local_50,&ctx->in,&local_70);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_50);
    WATParser::Err::~Err(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeSIMDExtract(Ctx& ctx, Index pos, SIMDExtractOp op, size_t) {
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return ctx.in.err("expected lane index");
  }
  return ctx.makeSIMDExtract(pos, op, *lane);
}